

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

png_byte check_location(png_const_structrp png_ptr,int location)

{
  uint local_14;
  int location_local;
  png_const_structrp png_ptr_local;
  
  local_14 = location & 0xb;
  if ((local_14 == 0) && ((png_ptr->mode & 0x8000) == 0)) {
    png_app_warning(png_ptr,"png_set_unknown_chunks now expects a valid location");
    local_14 = png_ptr->mode & 0xb;
  }
  if (local_14 != 0) {
    for (; local_14 != (local_14 & -local_14);
        local_14 = (local_14 & -local_14 ^ 0xffffffff) & local_14) {
    }
    return (png_byte)local_14;
  }
  png_error(png_ptr,"invalid location in png_set_unknown_chunks");
}

Assistant:

static png_byte
check_location(png_const_structrp png_ptr, int location)
{
   location &= (PNG_HAVE_IHDR|PNG_HAVE_PLTE|PNG_AFTER_IDAT);

   /* New in 1.6.0; copy the location and check it.  This is an API
    * change; previously the app had to use the
    * png_set_unknown_chunk_location API below for each chunk.
    */
   if (location == 0 && (png_ptr->mode & PNG_IS_READ_STRUCT) == 0)
   {
      /* Write struct, so unknown chunks come from the app */
      png_app_warning(png_ptr,
          "png_set_unknown_chunks now expects a valid location");
      /* Use the old behavior */
      location = (png_byte)(png_ptr->mode &
          (PNG_HAVE_IHDR|PNG_HAVE_PLTE|PNG_AFTER_IDAT));
   }

   /* This need not be an internal error - if the app calls
    * png_set_unknown_chunks on a read pointer it must get the location right.
    */
   if (location == 0)
      png_error(png_ptr, "invalid location in png_set_unknown_chunks");

   /* Now reduce the location to the top-most set bit by removing each least
    * significant bit in turn.
    */
   while (location != (location & -location))
      location &= ~(location & -location);

   /* The cast is safe because 'location' is a bit mask and only the low four
    * bits are significant.
    */
   return (png_byte)location;
}